

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall despot::Function::SetValue(Function *this,int pid,int cid,double value)

{
  pointer pvVar1;
  mapped_type *pmVar2;
  int local_c;
  mapped_type local_8;
  
  pvVar1 = (this->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->values_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar1) {
    local_c = cid;
    local_8 = value;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((this->map_).
                        super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + pid,&local_c);
    value = local_8;
  }
  else {
    pmVar2 = pvVar1[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + cid;
  }
  *pmVar2 = value;
  return;
}

Assistant:

void Function::SetValue(int pid, int cid, double value) {
	if (values_.size() > 0) { // TODO: possible refactoring to use a single data structure
		values_[pid][cid] = value;
	} else {
		map_[pid][cid] = value;
	}
}